

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::AppendBitset(ContainerCompressionState *state,bool null,uint16_t amount)

{
  undefined7 in_register_00000031;
  ValidityMask mask;
  ValidityMask local_28;
  
  if ((int)CONCAT71(in_register_00000031,null) != 0) {
    local_28.super_TemplatedValidityMask<unsigned_long>.validity_mask = state->uncompressed;
    local_28.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_28.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    SetInvalidRange(&local_28,(ulong)state->appended_count,
                    (ulong)amount + (ulong)state->appended_count);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

inline void AppendBitset(ContainerCompressionState &state, bool null, uint16_t amount) {
	D_ASSERT(state.uncompressed);
	if (null) {
		ValidityMask mask(state.uncompressed, ROARING_CONTAINER_SIZE);
		SetInvalidRange(mask, state.appended_count, state.appended_count + amount);
	}
}